

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O0

void __thiscall
winmd::reader::RetTypeSig::RetTypeSig(RetTypeSig *this,table_base *table,byte_view *data)

{
  bool bVar1;
  ElementType EVar2;
  undefined1 auStack_48 [7];
  ElementType element_type;
  byte_view cursor;
  byte_view *data_local;
  table_base *table_local;
  RetTypeSig *this_local;
  
  data_local = (byte_view *)table;
  table_local = (table_base *)this;
  parse_cmods(&this->m_cmod,table,data);
  bVar1 = is_by_ref(data);
  this->m_byref = bVar1;
  cppwinrt::std::optional<winmd::reader::TypeSig>::optional(&this->m_type);
  _auStack_48 = data->m_first;
  cursor.m_first = data->m_last;
  EVar2 = uncompress_enum<winmd::reader::ElementType>((byte_view *)auStack_48);
  if (EVar2 == Void) {
    data->m_first = _auStack_48;
    data->m_last = cursor.m_first;
  }
  else {
    std::optional<winmd::reader::TypeSig>::
    emplace<winmd::reader::table_base_const*&,winmd::reader::byte_view&>
              (&this->m_type,(table_base **)&data_local,data);
  }
  return;
}

Assistant:

RetTypeSig(table_base const* table, byte_view& data)
            : m_cmod(parse_cmods(table, data))
            , m_byref(is_by_ref(data))
        {
            auto cursor = data;
            auto element_type = uncompress_enum<ElementType>(cursor);
            if (element_type == ElementType::Void)
            {
                data = cursor;
            }
            else
            {
                m_type.emplace(table, data);
            }
        }